

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int add_pattern(yr_pattern **patterns,int *counter,char *pattern)

{
  yr_pattern *pyVar1;
  char *pcVar2;
  long lVar3;
  
  lVar3 = (long)*counter;
  pyVar1 = (yr_pattern *)realloc(*patterns,lVar3 * 0x10 + 0x10);
  if (pyVar1 != (yr_pattern *)0x0) {
    *patterns = pyVar1;
    *counter = *counter + 1;
    pcVar2 = strdup(pattern);
    pyVar1[lVar3].expr = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pyVar1[lVar3].invert = '\0';
      return 0;
    }
  }
  fwrite("yangre error: memory allocation error.\n",0x27,1,_stderr);
  return 1;
}

Assistant:

static int
add_pattern(struct yr_pattern **patterns, int *counter, char *pattern)
{
    void *reallocated;
    int orig_counter;

    /* Store the original number of items. */
    orig_counter = *counter;

    /* Reallocate 'patterns' memory with additional space. */
    reallocated = realloc(*patterns, (orig_counter + 1) * sizeof **patterns);
    if (!reallocated) {
        goto error;
    }
    (*patterns) = reallocated;
    /* Allocated memory is now larger. */
    (*counter)++;
    /* Copy the pattern and store it to the additonal space. */
    (*patterns)[orig_counter].expr = strdup(pattern);
    if (!(*patterns)[orig_counter].expr) {
        goto error;
    }
    (*patterns)[orig_counter].invert = 0;

    return 0;

error:
    fprintf(stderr, "yangre error: memory allocation error.\n");
    return 1;
}